

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestCase * __thiscall
vkt::createFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
          (vkt *this,TestContext *testCtx,TestNodeType type,string *name,string *desc,
          Function_conflict1 initPrograms,Function_conflict1 testFunction,CaseDefinition arg0)

{
  CaseDefinition arg0_;
  Function_conflict1 desc_00;
  string *name_00;
  TestNodeType type_00;
  TestContext *testCtx_00;
  InstanceFactory1<vkt::FunctionInstance1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>,_vkt::FunctionInstance1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>::Args,_vkt::FunctionPrograms1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>_>
  *this_00;
  undefined4 in_register_00000014;
  undefined1 local_68 [48];
  Function_conflict1 local_38;
  Function_conflict1 testFunction_local;
  Function_conflict1 initPrograms_local;
  string *desc_local;
  string *name_local;
  TestContext *pTStack_10;
  TestNodeType type_local;
  TestContext *testCtx_local;
  
  desc_local = (string *)CONCAT44(in_register_00000014,type);
  name_local._4_4_ = (TestNodeType)testCtx;
  local_38 = (Function_conflict1)initPrograms;
  testFunction_local = (Function_conflict1)desc;
  initPrograms_local = (Function_conflict1)name;
  pTStack_10 = (TestContext *)this;
  this_00 = (InstanceFactory1<vkt::FunctionInstance1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>,_vkt::FunctionInstance1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>::Args,_vkt::FunctionPrograms1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>_>
             *)operator_new(0x90);
  testCtx_00 = pTStack_10;
  type_00 = name_local._4_4_;
  name_00 = desc_local;
  desc_00 = initPrograms_local;
  FunctionPrograms1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>::FunctionPrograms1
            ((FunctionPrograms1<vkt::tessellation::(anonymous_namespace)::CaseDefinition> *)
             (local_68 + 0x28),(Function_conflict1)testFunction_local);
  unique0x100000d7 = arg0;
  arg0_._0_8_ = testFunction;
  FunctionInstance1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>::Args::Args
            ((Args *)local_68,local_38,arg0_);
  InstanceFactory1<vkt::FunctionInstance1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>,_vkt::FunctionInstance1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>::Args,_vkt::FunctionPrograms1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>_>
  ::InstanceFactory1(this_00,testCtx_00,type_00,name_00,(string *)desc_00,
                     (FunctionPrograms1<vkt::tessellation::(anonymous_namespace)::CaseDefinition>_conflict1
                      *)(local_68 + 0x28),(Args_conflict1 *)local_68);
  return &this_00->super_TestCase;
}

Assistant:

TestCase* createFunctionCaseWithPrograms (tcu::TestContext&								testCtx,
										  tcu::TestNodeType								type,
										  const std::string&							name,
										  const std::string&							desc,
										  typename FunctionPrograms1<Arg0>::Function	initPrograms,
										  typename FunctionInstance1<Arg0>::Function	testFunction,
										  Arg0											arg0)
{
	return new InstanceFactory1<FunctionInstance1<Arg0>, typename FunctionInstance1<Arg0>::Args, FunctionPrograms1<Arg0> >(
		testCtx, type, name, desc, FunctionPrograms1<Arg0>(initPrograms), typename FunctionInstance1<Arg0>::Args(testFunction, arg0));
}